

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Configure(cmake *this)

{
  cmCacheManager *pcVar1;
  cmState *this_00;
  char *pcVar2;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  char *local_80;
  char *delCacheVars;
  int ret;
  allocator local_39;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  if ((this->DoSuppressDevWarnings & 1U) != 0) {
    if ((this->SuppressDevWarnings & 1U) == 0) {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&ret,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                 (allocator *)((long)&delCacheVars + 7));
      cmCacheManager::AddCacheEntry
                (pcVar1,(string *)&ret,"FALSE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
      std::__cxx11::string::~string((string *)&ret);
      std::allocator<char>::~allocator((allocator<char> *)((long)&delCacheVars + 7));
    }
    else {
      pcVar1 = this->CacheManager;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_38,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_39);
      cmCacheManager::AddCacheEntry
                (pcVar1,&local_38,"TRUE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  delCacheVars._0_4_ = ActualConfigure(this);
  this_00 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_a1);
  pcVar2 = cmState::GetGlobalProperty(this_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    this_local._4_4_ = (int)delCacheVars;
  }
  else {
    local_80 = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar2,&local_c9);
    this_local._4_4_ = HandleDeleteCacheVariables(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Configure()
{
  if(this->DoSuppressDevWarnings)
    {
    if(this->SuppressDevWarnings)
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    else
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    }
  int ret = this->ActualConfigure();
  const char* delCacheVars = this->State
                    ->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if(delCacheVars && delCacheVars[0] != 0)
    {
    return this->HandleDeleteCacheVariables(delCacheVars);
    }
  return ret;

}